

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O1

int lyb_write(lyout *out,uint8_t *buf,size_t count,lyb_state *lybs)

{
  uint8_t uVar1;
  int iVar2;
  size_t *psVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  uint8_t *local_50;
  size_t local_40;
  char local_32;
  uint8_t local_31;
  uint8_t meta_buf [2];
  
  if ((out == (lyout *)0x0) || (lybs == (lyb_state *)0x0)) {
    __assert_fail("out && lybs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                  ,0x147,
                  "int lyb_write(struct lyout *, const uint8_t *, size_t, struct lyb_state *)");
  }
  iVar5 = 0;
  local_50 = buf;
  local_40 = count;
  while( true ) {
    do {
      sVar11 = local_40;
      if ((long)lybs->used < 1) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar10 = 0xffffffff;
        uVar7 = 0;
        do {
          bVar12 = 0xfe < lybs->written[uVar7] + sVar11;
          if (bVar12) {
            uVar10 = uVar7 & 0xffffffff;
          }
          uVar9 = (uint)uVar10;
          if (bVar12) {
            sVar11 = 0xff - lybs->written[uVar7];
          }
          uVar7 = uVar7 + 1;
        } while ((long)lybs->used != uVar7);
      }
      if ((uVar9 == 0xffffffff) && (local_40 == 0)) {
        return iVar5;
      }
      if (sVar11 != 0) {
        iVar4 = ly_write(out,(char *)local_50,sVar11);
        uVar7 = (ulong)iVar4;
        if (uVar7 < sVar11) {
          return -1;
        }
        iVar2 = lybs->used;
        if (0 < (long)iVar2) {
          psVar3 = lybs->written;
          lVar8 = 0;
          do {
            uVar10 = psVar3[lVar8] + uVar7;
            psVar3[lVar8] = uVar10;
            if (0xff < uVar10) {
              __assert_fail("lybs->written[i] <= LYB_SIZE_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                            ,0x164,
                            "int lyb_write(struct lyout *, const uint8_t *, size_t, struct lyb_state *)"
                           );
            }
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        local_40 = local_40 - uVar7;
        local_50 = local_50 + uVar7;
        iVar5 = iVar4 + iVar5;
      }
    } while ((int)uVar9 < 0);
    uVar7 = (ulong)uVar9;
    local_32 = (char)lybs->written[uVar7];
    local_31 = lybs->inner_chunks[uVar7];
    uVar6 = ly_write_skipped(out,lybs->position[uVar7],&local_32,2);
    if (uVar6 < 2) {
      return -1;
    }
    lybs->written[uVar7] = 0;
    lybs->inner_chunks[uVar7] = '\0';
    uVar6 = ly_write_skip(out,2,lybs->position + uVar7);
    if (uVar6 < 2) break;
    iVar5 = iVar5 + uVar6;
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        uVar1 = lybs->inner_chunks[uVar10];
        if (uVar1 == 0xff) {
          ly_log(lybs->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                 ,0x186);
          return -1;
        }
        lybs->inner_chunks[uVar10] = uVar1 + '\x01';
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
  }
  return -1;
}

Assistant:

static int
lyb_write(struct lyout *out, const uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, full_chunk_i;
    size_t r, to_write;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(out && lybs);

    while (1) {
        /* check for full data chunks */
        to_write = count;
        full_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous full chunks */
            if (lybs->written[i] + to_write >= LYB_SIZE_MAX) {
                /* full chunk, do not write more than allowed */
                to_write = LYB_SIZE_MAX - lybs->written[i];
                full_chunk_i = i;
            }
        }

        if ((full_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually writing some data, not just finishing another chunk */
        if (to_write) {
            r = ly_write(out, (char *)buf, to_write);
            if (r < to_write) {
                return -1;
            }

            for (i = 0; i < lybs->used; ++i) {
                /* increase all written counters */
                lybs->written[i] += r;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= r;
            buf += r;

            ret += r;
        }

        if (full_chunk_i > -1) {
            /* write the meta information (inner chunk count and chunk size) */
            meta_buf[0] = lybs->written[full_chunk_i] & 0xFF;
            meta_buf[1] = lybs->inner_chunks[full_chunk_i] & 0xFF;

            r = ly_write_skipped(out, lybs->position[full_chunk_i], (char *)meta_buf, LYB_META_BYTES);
            if (r < LYB_META_BYTES) {
                return -1;
            }

            /* zero written and inner chunks */
            lybs->written[full_chunk_i] = 0;
            lybs->inner_chunks[full_chunk_i] = 0;

            /* skip space for another chunk size */
            r = ly_write_skip(out, LYB_META_BYTES, &lybs->position[full_chunk_i]);
            if (r < LYB_META_BYTES) {
                return -1;
            }

            ret += r;

            /* increase inner chunk count */
            for (i = 0; i < full_chunk_i; ++i) {
                if (lybs->inner_chunks[i] == LYB_INCHUNK_MAX) {
                    LOGINT(lybs->ctx);
                    return -1;
                }
                ++lybs->inner_chunks[i];
            }
        }
    }

    return ret;
}